

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

bool __thiscall
ON_ObjectArray<ON_BrepFace>::QuickSort
          (ON_ObjectArray<ON_BrepFace> *this,_func_int_ON_BrepFace_ptr_ON_BrepFace_ptr *compar)

{
  int local_20;
  bool local_19;
  int i;
  bool rc;
  _func_int_ON_BrepFace_ptr_ON_BrepFace_ptr *compar_local;
  ON_ObjectArray<ON_BrepFace> *this_local;
  
  local_19 = false;
  if ((((this->super_ON_ClassArray<ON_BrepFace>).m_a != (ON_BrepFace *)0x0) &&
      (0 < (this->super_ON_ClassArray<ON_BrepFace>).m_count)) &&
     (compar != (_func_int_ON_BrepFace_ptr_ON_BrepFace_ptr *)0x0)) {
    if (1 < (this->super_ON_ClassArray<ON_BrepFace>).m_count) {
      ON_qsort((this->super_ON_ClassArray<ON_BrepFace>).m_a,
               (long)(this->super_ON_ClassArray<ON_BrepFace>).m_count,0xd8,
               (_func_int_void_ptr_void_ptr *)compar);
      for (local_20 = 0; local_20 < (this->super_ON_ClassArray<ON_BrepFace>).m_count;
          local_20 = local_20 + 1) {
        (*(this->super_ON_ClassArray<ON_BrepFace>).m_a[local_20].super_ON_SurfaceProxy.
          super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object[5])();
      }
    }
    local_19 = true;
  }
  return local_19;
}

Assistant:

bool ON_ObjectArray<T>::QuickSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  // The "this->" in this->m_count and this->m_a 
  // are needed for gcc 4 to compile.
  if ( this->m_a && this->m_count > 0 && compar ) 
  {
    if ( this->m_count > 1 )
    {
      ON_qsort( this->m_a, this->m_count, sizeof(T), (int(*)(const void*,const void*))compar );

      // The MemoryRelocate step is required to synch userdata back pointers
      // so the user data destructor will work correctly.
      int i;
      for ( i = 0; i < this->m_count; i++ )
      {
        this->m_a[i].MemoryRelocate();
      }
    }
    rc = true;
  }
  return rc;
}